

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genx.c
# Opt level: O2

int genxCharClass(genxWriter w,int c)

{
  uint uVar1;
  
  if (-1 < c) {
    if ((uint)c < 0x10000) {
      uVar1 = (uint)w->xmlChars[(uint)c];
    }
    else {
      uVar1 = (uint)((uint)c < 0x110000);
    }
    if (uVar1 != 0) {
      uVar1 = 1;
      goto LAB_001c9ab3;
    }
  }
  uVar1 = 0;
LAB_001c9ab3:
  if ((uint)c < 0x10000) {
    uVar1 = uVar1 | w->xmlChars[(uint)c] & 6;
  }
  return uVar1;
}

Assistant:

int genxCharClass(genxWriter w, int c)
{
  int ret = 0;

  if (isXMLChar(w, c))
    ret |= GENX_XML_CHAR;
  if (isNameChar(w, c))
    ret |= GENX_NAMECHAR;
  if (isLetter(w, c))
    ret |= GENX_LETTER;
  return ret;
}